

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FPTest_Multiply_Test::TestBody(FPTest_Multiply_Test *this)

{
  fp y;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  fp fVar4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  fp v;
  AssertHelper *in_stack_fffffffffffffe70;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  int iVar6;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult *this_01;
  undefined8 in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  fp in_stack_fffffffffffffec8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_f8;
  significand_type local_e8;
  int local_e0;
  fp local_d8;
  fp local_c8;
  significand_type local_b8;
  int local_b0;
  undefined4 local_94;
  AssertionResult local_90 [3];
  undefined4 local_5c;
  AssertionResult local_58;
  significand_type local_48;
  int local_40;
  fp local_38;
  fp local_28;
  significand_type local_18;
  int local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  fmt::v5::internal::fp::fp(&local_28,0x7b00000000,4);
  fmt::v5::internal::fp::fp(&local_38,0x3800000000,7);
  fVar4._8_7_ = in_stack_fffffffffffffec0;
  fVar4.f = in_stack_fffffffffffffeb8;
  fVar4._15_1_ = in_stack_fffffffffffffec7;
  fVar4 = fmt::v5::internal::operator*(in_stack_fffffffffffffec8,fVar4);
  local_48 = fVar4.f;
  local_40 = fVar4.e;
  local_5c = 0x1ae8;
  pAVar5 = &local_58;
  local_18 = local_48;
  local_10 = local_40;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (uint *)in_stack_fffffffffffffe70);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    testing::AssertionResult::failure_message((AssertionResult *)0x10fbd6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,type,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8.ptr_);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x10fc33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fc88);
  local_94 = 0x4b;
  this_01 = local_90;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (int *)in_stack_fffffffffffffe70);
  iVar6 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10fd29);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),iVar6,
               in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8.ptr_);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x10fd86);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fdde);
  fmt::v5::internal::fp::fp(&local_c8,0x7b00000000,4);
  fmt::v5::internal::fp::fp(&local_d8,0x11b80000000,8);
  y._8_7_ = in_stack_fffffffffffffec0;
  y.f = (significand_type)pAVar5;
  y._15_1_ = uVar1;
  fVar4 = fmt::v5::internal::operator*(in_stack_fffffffffffffec8,y);
  local_e8 = fVar4.f;
  local_e0 = fVar4.e;
  pAVar5 = &local_f8;
  local_b8 = local_e8;
  local_b0 = local_e0;
  local_18 = local_e8;
  local_10 = local_e0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
            (&pAVar5->success_,in_stack_fffffffffffffe80,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (uint *)in_stack_fffffffffffffe70);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffe80 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10ff25);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe90),
               (int)((ulong)pAVar5 >> 0x20),in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8.ptr_);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x10ff82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ffd7);
  this_00 = (AssertionResult *)&stack0xfffffffffffffee0;
  testing::internal::EqHelper<false>::Compare<int,int>
            (&pAVar5->success_,in_stack_fffffffffffffe80,
             (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),(int *)this_00);
  iVar6 = (int)((ulong)pAVar5 >> 0x20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar2) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0x110069);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe90),iVar6,
               in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffef0,(Message *)in_stack_fffffffffffffee8.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x1100b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110101);
  return;
}

Assistant:

TEST(FPTest, Multiply) {
  auto v = fp(123ULL << 32, 4) * fp(56ULL << 32, 7);
  EXPECT_EQ(v.f, 123u * 56u);
  EXPECT_EQ(v.e, 4 + 7 + 64);
  v = fp(123ULL << 32, 4) * fp(567ULL << 31, 8);
  EXPECT_EQ(v.f, (123 * 567 + 1u) / 2);
  EXPECT_EQ(v.e, 4 + 8 + 64);
}